

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

void __thiscall menuwindow::draw(menuwindow *this)

{
  Fl_Menu_Item *pFVar1;
  menuwindow *pmVar2;
  int iVar3;
  
  if ((this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.damage_ == '\x01') {
    iVar3 = this->drawn_selected;
    if (this->selected != iVar3) {
      pFVar1 = Fl_Menu_Item::next(this->menu,iVar3);
      drawentry(this,pFVar1,iVar3,1);
      iVar3 = this->selected;
      pFVar1 = Fl_Menu_Item::next(this->menu,iVar3);
      drawentry(this,pFVar1,iVar3,1);
    }
  }
  else {
    pmVar2 = (menuwindow *)button;
    if (button == (Fl_Menu_ *)0x0) {
      pmVar2 = this;
    }
    iVar3 = 0;
    fl_draw_box((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                      super_Fl_Group.super_Fl_Widget.box_,0,0,
                (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                super_Fl_Widget.w_,
                (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                super_Fl_Widget.h_,
                (pmVar2->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget.color_);
    if (this->menu != (Fl_Menu_Item *)0x0) {
      for (pFVar1 = Fl_Menu_Item::first(this->menu); pFVar1->text != (char *)0x0;
          pFVar1 = Fl_Menu_Item::next(pFVar1,1)) {
        drawentry(this,pFVar1,iVar3,0);
        iVar3 = iVar3 + 1;
      }
    }
  }
  this->drawn_selected = this->selected;
  return;
}

Assistant:

void menuwindow::draw() {
  if (damage() != FL_DAMAGE_CHILD) {	// complete redraw
    fl_draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    if (menu) {
      const Fl_Menu_Item* m; int j;
      for (m=menu->first(), j=0; m->text; j++, m = m->next()) drawentry(m, j, 0);
    }
  } else {
    if (damage() & FL_DAMAGE_CHILD && selected!=drawn_selected) { // change selection
      drawentry(menu->next(drawn_selected), drawn_selected, 1);
      drawentry(menu->next(selected), selected, 1);
    }
  }	    
  drawn_selected = selected;
}